

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::ExpandRegistryValues(string *source,KeyWOW64 param_2)

{
  bool bVar1;
  char local_1a1;
  string key;
  cmAlphaNum local_180;
  string reg;
  cmAlphaNum local_130;
  RegularExpression regEntry;
  
  cmsys::RegularExpression::RegularExpression(&regEntry,"\\[(HKEY[^]]*)\\]");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find(&regEntry,source);
    if (!bVar1) break;
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&key,&regEntry.regmatch,1);
    local_180.View_._M_len = 1;
    local_180.View_._M_str = local_180.Digits_;
    local_180.Digits_[0] = '[';
    local_130.View_._M_len = key._M_string_length;
    local_130.View_._M_str = key._M_dataplus._M_p;
    local_1a1 = ']';
    cmStrCat<char>(&reg,&local_180,&local_130,&local_1a1);
    cmsys::SystemTools::ReplaceString(source,reg._M_dataplus._M_p,"/registry");
    std::__cxx11::string::~string((string *)&reg);
    std::__cxx11::string::~string((string *)&key);
  }
  cmsys::RegularExpression::~RegularExpression(&regEntry);
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = cmStrCat('[', key, ']');
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}